

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

bool __thiscall
QPDF::JSONReactor::setNextStateIfDictionary(JSONReactor *this,string *key,JSON *value,state_e next)

{
  bool bVar1;
  qpdf_offset_t offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  state_e local_2c;
  JSON *pJStack_28;
  state_e next_local;
  JSON *value_local;
  string *key_local;
  JSONReactor *this_local;
  
  local_2c = next;
  pJStack_28 = value;
  value_local = (JSON *)key;
  key_local = (string *)this;
  bVar1 = JSON::isDictionary(value);
  if (bVar1) {
    this->next_state = local_2c;
  }
  else {
    offset = JSON::getStart(pJStack_28);
    std::operator+(&local_70,"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_local)
    ;
    std::operator+(&local_50,&local_70,"\" must be a dictionary");
    error(this,offset,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return bVar1;
}

Assistant:

bool
QPDF::JSONReactor::setNextStateIfDictionary(std::string const& key, JSON const& value, state_e next)
{
    // Use this method when the next state is for processing a nested dictionary.
    if (value.isDictionary()) {
        this->next_state = next;
        return true;
    }
    error(value.getStart(), "\"" + key + "\" must be a dictionary");
    return false;
}